

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateNotationUse(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *notationName)

{
  xmlNotationPtr local_30;
  xmlNotationPtr notaDecl;
  xmlChar *notationName_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (((doc == (xmlDocPtr)0x0) || (doc->intSubset == (_xmlDtd *)0x0)) ||
     (notationName == (xmlChar *)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    local_30 = xmlGetDtdNotationDesc(doc->intSubset,notationName);
    if ((local_30 == (xmlNotationPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
      local_30 = xmlGetDtdNotationDesc(doc->extSubset,notationName);
    }
    if (local_30 == (xmlNotationPtr)0x0) {
      xmlErrValidNode(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_NOTATION,"NOTATION %s is not declared\n",
                      notationName,(xmlChar *)0x0,(xmlChar *)0x0);
      ctxt_local._4_4_ = 0;
    }
    else {
      ctxt_local._4_4_ = 1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateNotationUse(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       const xmlChar *notationName) {
    xmlNotationPtr notaDecl;
    if ((doc == NULL) || (doc->intSubset == NULL) ||
        (notationName == NULL)) return(-1);

    notaDecl = xmlGetDtdNotationDesc(doc->intSubset, notationName);
    if ((notaDecl == NULL) && (doc->extSubset != NULL))
	notaDecl = xmlGetDtdNotationDesc(doc->extSubset, notationName);

    if (notaDecl == NULL) {
	xmlErrValidNode(ctxt, (xmlNodePtr) doc, XML_DTD_UNKNOWN_NOTATION,
	                "NOTATION %s is not declared\n",
		        notationName, NULL, NULL);
	return(0);
    }
    return(1);
}